

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O0

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetNormalIfPlanar
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  Point PVar6;
  float local_250 [2];
  float local_248;
  float local_230 [2];
  float local_228;
  undefined1 local_21c [8];
  Point normal_direction;
  float local_208;
  ulong uStack_1f0;
  bool is_linear;
  size_t i;
  float fStack_1e0;
  Point pair_direction;
  float local_1d0;
  undefined1 local_1c8 [8];
  Point first_pair_direction;
  FatalMessage local_1b0;
  uint local_34;
  size_type local_30;
  string *local_28;
  string *_result;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  *array_geometry_local;
  
  _result = (string *)array_geometry;
  local_30 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::size(array_geometry);
  local_34 = 1;
  local_28 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       (&local_30,&local_34,"array_geometry.size() > 1u");
  if (local_28 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
               ,0x4c,local_28);
    rtc::FatalMessage::stream(&local_1b0);
    rtc::FatalMessage::~FatalMessage(&local_1b0);
  }
  pvVar3 = std::
           vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
           operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                       *)_result,0);
  pvVar4 = std::
           vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
           operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                       *)_result,1);
  PVar6 = PairDirection(pvVar3,pvVar4);
  pair_direction.c._4_8_ = PVar6.c._0_8_;
  local_1c8._0_4_ = pair_direction.c[1];
  local_1c8._4_4_ = pair_direction.c[2];
  local_1d0 = PVar6.c[2];
  first_pair_direction.c[0] = local_1d0;
  unique0x100002a6 = PVar6;
  CartesianPoint<float>::CartesianPoint((CartesianPoint<float> *)((long)&i + 4),0.0,0.0,0.0);
  uStack_1f0 = 2;
  bVar2 = true;
  while( true ) {
    sVar5 = std::
            vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
            size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                  *)_result);
    bVar1 = false;
    if (uStack_1f0 < sVar5) {
      bVar1 = bVar2;
    }
    if (!bVar1) break;
    pvVar3 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                           *)_result,uStack_1f0 - 1);
    pvVar4 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                           *)_result,uStack_1f0);
    PVar6 = PairDirection(pvVar3,pvVar4);
    normal_direction.c._4_8_ = PVar6.c._0_8_;
    local_208 = PVar6.c[2];
    i._4_4_ = normal_direction.c[1];
    fStack_1e0 = normal_direction.c[2];
    pair_direction.c[0] = local_208;
    unique0x1000029a = PVar6;
    bVar1 = AreParallel((Point *)local_1c8,(Point *)((long)&i + 4));
    if (!bVar1) {
      bVar2 = false;
    }
    uStack_1f0 = uStack_1f0 + 1;
  }
  if (bVar2) {
    rtc::Optional<webrtc::CartesianPoint<float>_>::Optional
              ((Optional<webrtc::CartesianPoint<float>_> *)&array_geometry_local);
  }
  else {
    PVar6 = CrossProduct((Point *)local_1c8,(Point *)((long)&i + 4));
    local_230 = PVar6.c._0_8_;
    local_21c._0_4_ = local_230[0];
    local_21c._4_4_ = local_230[1];
    local_228 = PVar6.c[2];
    normal_direction.c[0] = local_228;
    for (; sVar5 = std::
                   vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                   ::size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                           *)_result), uStack_1f0 < sVar5; uStack_1f0 = uStack_1f0 + 1) {
      pvVar3 = std::
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                             *)_result,uStack_1f0 - 1);
      pvVar4 = std::
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                             *)_result,uStack_1f0);
      PVar6 = PairDirection(pvVar3,pvVar4);
      local_250 = PVar6.c._0_8_;
      local_248 = PVar6.c[2];
      i._4_4_ = local_250[0];
      fStack_1e0 = local_250[1];
      pair_direction.c[0] = local_248;
      bVar2 = ArePerpendicular((Point *)local_21c,(Point *)((long)&i + 4));
      if (!bVar2) {
        rtc::Optional<webrtc::CartesianPoint<float>_>::Optional
                  ((Optional<webrtc::CartesianPoint<float>_> *)&array_geometry_local);
        return _array_geometry_local;
      }
    }
    rtc::Optional<webrtc::CartesianPoint<float>_>::Optional
              ((Optional<webrtc::CartesianPoint<float>_> *)&array_geometry_local,
               (CartesianPoint<float> *)local_21c);
  }
  return _array_geometry_local;
}

Assistant:

rtc::Optional<Point> GetNormalIfPlanar(
    const std::vector<Point>& array_geometry) {
  RTC_DCHECK_GT(array_geometry.size(), 1u);
  const Point first_pair_direction =
      PairDirection(array_geometry[0], array_geometry[1]);
  Point pair_direction(0.f, 0.f, 0.f);
  size_t i = 2u;
  bool is_linear = true;
  for (; i < array_geometry.size() && is_linear; ++i) {
    pair_direction = PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!AreParallel(first_pair_direction, pair_direction)) {
      is_linear = false;
    }
  }
  if (is_linear) {
    return rtc::Optional<Point>();
  }
  const Point normal_direction =
      CrossProduct(first_pair_direction, pair_direction);
  for (; i < array_geometry.size(); ++i) {
    pair_direction = PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!ArePerpendicular(normal_direction, pair_direction)) {
      return rtc::Optional<Point>();
    }
  }
  return rtc::Optional<Point>(normal_direction);
}